

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

uint __thiscall FreeTypeFaceWrapper::GetFontFlags(FreeTypeFaceWrapper *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double extraout_XMM0_Qa;
  
  if (this->mFace == (FT_Face)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)((ulong)this->mFace->face_flags >> 2) & 1;
  }
  uVar4 = uVar3;
  if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
    iVar2 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[8])();
    uVar4 = uVar3 + 2;
    if ((char)iVar2 == '\0') {
      uVar4 = uVar3;
    }
  }
  bVar1 = IsDefiningCharsNotInAdobeStandardLatin(this);
  uVar3 = 0x20;
  if (bVar1) {
    uVar3 = 4;
  }
  uVar3 = uVar3 | uVar4;
  if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
    iVar2 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[9])();
    if ((char)iVar2 != '\0') {
      uVar3 = uVar3 | 8;
    }
    if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
      (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[2])();
      uVar4 = uVar3;
      if (extraout_XMM0_Qa != 0.0) {
        uVar4 = uVar3 + 0x40;
      }
      if (NAN(extraout_XMM0_Qa)) {
        uVar4 = uVar3 + 0x40;
      }
      uVar3 = uVar4;
      if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
        iVar2 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[10])();
        uVar3 = uVar4 + 0x40000;
        if ((char)iVar2 == '\0') {
          uVar3 = uVar4;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned int FreeTypeFaceWrapper::GetFontFlags()
{
	unsigned int flags = 0;

	/* 
		flags are a combination of:
		
		1 - Fixed Pitch
		2 - Serif
		3 - Symbolic
		4 - Script
		6 - Nonsymbolic
		7 - Italic
		17 - AllCap
		18 - SmallCap
		19 - ForceBold

		not doing allcap,smallcap
	*/

	if(IsFixedPitch())
		flags |= 1;
	if(IsSerif())
		flags |= 2;
	if(IsSymbolic())
		flags |= 4;
	else
		flags |= 32;
	if(IsScript())
		flags |= 8;
	if(IsItalic())
		flags |= 64;
	if(IsForceBold())
		flags |= (1<<18);

	return flags;
}